

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::MessageSetItemByteSize
          (Extension *this,int number)

{
  FieldType FVar1;
  int iVar2;
  const_reference plVar3;
  ulong uVar4;
  const_reference puVar5;
  ulong *puVar6;
  const_reference puVar7;
  const_reference piVar8;
  undefined4 extraout_var;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *pVVar9;
  undefined4 extraout_var_00;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  size_t sVar14;
  RepeatedPtrFieldBase *pRVar15;
  int iVar16;
  LogMessage LStack_38;
  
  if ((this->type == '\v') && (this->is_repeated != true)) {
    if ((this->field_0xa & 2) == 0) {
      iVar2 = 0x1f;
      if ((number | 1U) != 0) {
        for (; (number | 1U) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      if ((this->field_0xa & 4) == 0) {
        lVar11 = (**(code **)(*(long *)this->field_0 + 0x18))();
      }
      else {
        lVar11 = (**(code **)(*(long *)this->field_0 + 0x68))();
      }
      uVar12 = (uint)lVar11 | 1;
      iVar16 = 0x1f;
      if (uVar12 != 0) {
        for (; uVar12 >> iVar16 == 0; iVar16 = iVar16 + -1) {
        }
      }
      sVar14 = (ulong)(iVar2 * 9 + 0x49U >> 6) + 4 + lVar11 + (ulong)(iVar16 * 9 + 0x49U >> 6);
    }
    else {
      sVar14 = 0;
    }
    return sVar14;
  }
  if (this->is_repeated != true) {
    if ((this->field_0xa & 2) != 0) {
      return 0;
    }
    FVar1 = this->type;
    if ((byte)(FVar1 - 0x13) < 0xee) {
LAB_001f84db:
      ByteSize();
LAB_001f84e3:
      ByteSize();
LAB_001f84eb:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&LStack_38);
    }
    uVar12 = number * 8 + 1;
    iVar2 = 0x1f;
    if (uVar12 != 0) {
      for (; uVar12 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar14 = (ulong)(iVar2 * 9 + 0x49U >> 6) << (FVar1 == '\n');
    switch(FVar1) {
    case '\x01':
    case '\x06':
    case '\x10':
      return sVar14 + 8;
    case '\x02':
    case '\a':
    case '\x0f':
      return sVar14 + 4;
    case '\x03':
    case '\x04':
      uVar4 = (this->field_0).uint64_t_value;
      break;
    case '\x05':
    case '\x0e':
      uVar4 = (ulong)(this->field_0).int32_t_value;
      break;
    case '\b':
      return sVar14 + 1;
    case '\t':
    case '\f':
      uVar4 = *(ulong *)((this->field_0).int64_t_value + 8);
      sVar14 = sVar14 + uVar4;
      goto LAB_001f8196;
    case '\n':
      uVar4 = (**(code **)(*(long *)this->field_0 + 0x18))();
      goto LAB_001f8297;
    case '\v':
      if ((this->field_0xa & 4) == 0) {
        lVar11 = (**(code **)(*(long *)this->field_0 + 0x18))();
      }
      else {
        lVar11 = (**(code **)(*(long *)this->field_0 + 0x68))();
      }
      uVar12 = (uint)lVar11 | 1;
      iVar2 = 0x1f;
      if (uVar12 != 0) {
        for (; uVar12 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      return sVar14 + lVar11 + (ulong)(iVar2 * 9 + 0x49U >> 6);
    case '\r':
      uVar4 = (ulong)(this->field_0).uint32_t_value;
LAB_001f8196:
      uVar12 = (uint)uVar4 | 1;
      iVar2 = 0x1f;
      if (uVar12 != 0) {
        for (; uVar12 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      goto LAB_001f828e;
    case '\x11':
      uVar12 = (this->field_0).int32_t_value >> 0x1f ^ (this->field_0).int32_t_value * 2 | 1;
      iVar2 = 0x1f;
      if (uVar12 != 0) {
        for (; uVar12 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      goto LAB_001f828e;
    case '\x12':
      uVar4 = (this->field_0).int64_t_value >> 0x3f ^ (this->field_0).int64_t_value * 2;
      break;
    default:
      return sVar14;
    }
    lVar11 = 0x3f;
    if ((uVar4 | 1) != 0) {
      for (; (uVar4 | 1) >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    iVar2 = (int)lVar11;
LAB_001f828e:
    uVar4 = (ulong)(iVar2 * 9 + 0x49U >> 6);
LAB_001f8297:
    return sVar14 + uVar4;
  }
  FVar1 = this->type;
  if (this->is_packed == true) {
    if ((byte)(FVar1 - 0x13) < 0xee) {
      ByteSize();
      goto LAB_001f84db;
    }
    switch(FVar1) {
    case '\x01':
    case '\x06':
    case '\x10':
      uVar12 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                            (undefined1  [16])
                            ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                            (undefined1  [16])0x4) == (undefined1  [16])0x0);
      uVar13 = (ulong)uVar12 << 3;
      break;
    case '\x02':
    case '\a':
    case '\x0f':
      uVar12 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                            (undefined1  [16])
                            ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                            (undefined1  [16])0x4) == (undefined1  [16])0x0);
      uVar13 = (ulong)uVar12 << 2;
      break;
    case '\x03':
      iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      iVar16 = 0;
      if (iVar2 < 1) goto switchD_001f7bdd_default;
      uVar13 = 0;
      do {
        puVar6 = (ulong *)RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar16);
        lVar11 = 0x3f;
        if ((*puVar6 | 1) != 0) {
          for (; (*puVar6 | 1) >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        uVar13 = uVar13 + ((int)lVar11 * 9 + 0x49U >> 6);
        iVar16 = iVar16 + 1;
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar16 < iVar2);
      break;
    case '\x04':
      iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      iVar16 = 0;
      if (iVar2 < 1) goto switchD_001f7bdd_default;
      uVar13 = 0;
      do {
        puVar7 = RepeatedField<unsigned_long>::Get
                           ((RepeatedField<unsigned_long> *)this->field_0,iVar16);
        lVar11 = 0x3f;
        if ((*puVar7 | 1) != 0) {
          for (; (*puVar7 | 1) >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        uVar13 = uVar13 + ((int)lVar11 * 9 + 0x49U >> 6);
        iVar16 = iVar16 + 1;
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar16 < iVar2);
      break;
    case '\x05':
      iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      iVar16 = 0;
      if (iVar2 < 1) goto switchD_001f7bdd_default;
      uVar13 = 0;
      do {
        piVar8 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar16);
        lVar11 = 0x3f;
        if (((long)*piVar8 | 1U) != 0) {
          for (; ((long)*piVar8 | 1U) >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        uVar13 = uVar13 + ((int)lVar11 * 9 + 0x49U >> 6);
        iVar16 = iVar16 + 1;
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar16 < iVar2);
      break;
    case '\b':
      uVar12 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                            (undefined1  [16])
                            ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                            (undefined1  [16])0x4) == (undefined1  [16])0x0);
      uVar13 = (ulong)uVar12;
      break;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x5e4);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&LStack_38,(char (*) [37])"Non-primitive types can\'t be packed.");
      goto LAB_001f84eb;
    case '\r':
      iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      iVar16 = 0;
      if (iVar2 < 1) goto switchD_001f7bdd_default;
      uVar13 = 0;
      do {
        puVar5 = RepeatedField<unsigned_int>::Get
                           ((RepeatedField<unsigned_int> *)this->field_0,iVar16);
        iVar2 = 0x1f;
        if ((*puVar5 | 1) != 0) {
          for (; (*puVar5 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar13 = uVar13 + (iVar2 * 9 + 0x49U >> 6);
        iVar16 = iVar16 + 1;
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar16 < iVar2);
      break;
    case '\x0e':
      iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      iVar16 = 0;
      if (iVar2 < 1) goto switchD_001f7bdd_default;
      uVar13 = 0;
      do {
        piVar8 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar16);
        lVar11 = 0x3f;
        if (((long)*piVar8 | 1U) != 0) {
          for (; ((long)*piVar8 | 1U) >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        uVar13 = uVar13 + ((int)lVar11 * 9 + 0x49U >> 6);
        iVar16 = iVar16 + 1;
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar16 < iVar2);
      break;
    case '\x11':
      iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      iVar16 = 0;
      if (iVar2 < 1) goto switchD_001f7bdd_default;
      uVar13 = 0;
      do {
        piVar8 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar16);
        uVar12 = *piVar8 >> 0x1f ^ *piVar8 * 2 | 1;
        iVar2 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar13 = uVar13 + (iVar2 * 9 + 0x49U >> 6);
        iVar16 = iVar16 + 1;
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar16 < iVar2);
      break;
    case '\x12':
      iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                           (undefined1  [16])
                           ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
      iVar16 = 0;
      if (iVar2 < 1) goto switchD_001f7bdd_default;
      uVar13 = 0;
      do {
        plVar3 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar16);
        uVar4 = *plVar3 >> 0x3f ^ *plVar3 * 2 | 1;
        lVar11 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        uVar13 = uVar13 + ((int)lVar11 * 9 + 0x49U >> 6);
        iVar16 = iVar16 + 1;
        iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                             (undefined1  [16])
                             ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                             (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar16 < iVar2);
      break;
    default:
switchD_001f7bdd_default:
      uVar13 = 0;
    }
    *(uint *)(this->cached_size).int_ = (uint)uVar13;
    if (uVar13 == 0) {
switchD_001f7c4e_default:
      return 0;
    }
    uVar12 = (uint)uVar13 | 1;
    iVar2 = 0x1f;
    if (uVar12 != 0) {
      for (; uVar12 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    uVar4 = (ulong)(iVar2 * 9 + 0x49U >> 6);
    uVar12 = number * 8 + 3;
    iVar2 = 0x1f;
    if (uVar12 != 0) {
      for (; uVar12 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar14 = uVar13 + (iVar2 * 9 + 0x49U >> 6);
    goto LAB_001f8297;
  }
  if ((byte)(FVar1 - 0x13) < 0xee) goto LAB_001f84e3;
  uVar12 = number * 8 + 1;
  iVar2 = 0x1f;
  if (uVar12 != 0) {
    for (; uVar12 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  lVar11 = (ulong)(iVar2 * 9 + 0x49U >> 6) << (FVar1 == '\n');
  switch(FVar1) {
  case '\x01':
  case '\x06':
  case '\x10':
    lVar11 = lVar11 + 8;
    goto LAB_001f8177;
  case '\x02':
  case '\a':
  case '\x0f':
    lVar11 = lVar11 + 4;
    goto LAB_001f8177;
  case '\x03':
    uVar12 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                          (undefined1  [16])
                          ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                          (undefined1  [16])0x4) == (undefined1  [16])0x0);
    sVar14 = lVar11 * (ulong)uVar12;
    iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        puVar6 = (ulong *)RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar2);
        lVar11 = 0x3f;
        if ((*puVar6 | 1) != 0) {
          for (; (*puVar6 | 1) >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        sVar14 = sVar14 + ((int)lVar11 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        iVar16 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar2 < iVar16);
    }
    break;
  case '\x04':
    uVar12 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                          (undefined1  [16])
                          ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                          (undefined1  [16])0x4) == (undefined1  [16])0x0);
    sVar14 = lVar11 * (ulong)uVar12;
    iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        puVar7 = RepeatedField<unsigned_long>::Get
                           ((RepeatedField<unsigned_long> *)this->field_0,iVar2);
        lVar11 = 0x3f;
        if ((*puVar7 | 1) != 0) {
          for (; (*puVar7 | 1) >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        sVar14 = sVar14 + ((int)lVar11 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        iVar16 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar2 < iVar16);
    }
    break;
  case '\x05':
    uVar12 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                          (undefined1  [16])
                          ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                          (undefined1  [16])0x4) == (undefined1  [16])0x0);
    sVar14 = lVar11 * (ulong)uVar12;
    iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        piVar8 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar2);
        lVar11 = 0x3f;
        if (((long)*piVar8 | 1U) != 0) {
          for (; ((long)*piVar8 | 1U) >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        sVar14 = sVar14 + ((int)lVar11 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        iVar16 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar2 < iVar16);
    }
    break;
  case '\b':
    lVar11 = lVar11 + 1;
LAB_001f8177:
    uVar12 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                          (undefined1  [16])
                          ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                          (undefined1  [16])0x4) == (undefined1  [16])0x0);
    sVar14 = lVar11 * (ulong)uVar12;
    break;
  case '\t':
    pRVar15 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
    sVar14 = lVar11 * (ulong)(uint)pRVar15->current_size_;
    if (0 < pRVar15->current_size_) {
      iVar2 = 0;
      do {
        pVVar10 = RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                            (pRVar15,iVar2);
        uVar12 = (uint)pVVar10->_M_string_length | 1;
        iVar16 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar16 == 0; iVar16 = iVar16 + -1) {
          }
        }
        sVar14 = sVar14 + pVVar10->_M_string_length + (ulong)(iVar16 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        pRVar15 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
      } while (iVar2 < pRVar15->current_size_);
    }
    break;
  case '\n':
    pRVar15 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
    sVar14 = lVar11 * (ulong)(uint)pRVar15->current_size_;
    if (0 < pRVar15->current_size_) {
      iVar2 = 0;
      do {
        pVVar9 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                           (pRVar15,iVar2);
        iVar16 = (*pVVar9->_vptr_MessageLite[3])(pVVar9);
        sVar14 = sVar14 + CONCAT44(extraout_var,iVar16);
        iVar2 = iVar2 + 1;
        pRVar15 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
      } while (iVar2 < pRVar15->current_size_);
    }
    break;
  case '\v':
    pRVar15 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
    sVar14 = lVar11 * (ulong)(uint)pRVar15->current_size_;
    if (0 < pRVar15->current_size_) {
      iVar2 = 0;
      do {
        pVVar9 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                           (pRVar15,iVar2);
        uVar12 = (*pVVar9->_vptr_MessageLite[3])(pVVar9);
        iVar16 = 0x1f;
        if ((uVar12 | 1) != 0) {
          for (; (uVar12 | 1) >> iVar16 == 0; iVar16 = iVar16 + -1) {
          }
        }
        sVar14 = sVar14 + CONCAT44(extraout_var_00,uVar12) + (ulong)(iVar16 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        pRVar15 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
      } while (iVar2 < pRVar15->current_size_);
    }
    break;
  case '\f':
    pRVar15 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
    sVar14 = lVar11 * (ulong)(uint)pRVar15->current_size_;
    if (0 < pRVar15->current_size_) {
      iVar2 = 0;
      do {
        pVVar10 = RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                            (pRVar15,iVar2);
        uVar12 = (uint)pVVar10->_M_string_length | 1;
        iVar16 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar16 == 0; iVar16 = iVar16 + -1) {
          }
        }
        sVar14 = sVar14 + pVVar10->_M_string_length + (ulong)(iVar16 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        pRVar15 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
      } while (iVar2 < pRVar15->current_size_);
    }
    break;
  case '\r':
    uVar12 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                          (undefined1  [16])
                          ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                          (undefined1  [16])0x4) == (undefined1  [16])0x0);
    sVar14 = lVar11 * (ulong)uVar12;
    iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        puVar5 = RepeatedField<unsigned_int>::Get
                           ((RepeatedField<unsigned_int> *)this->field_0,iVar2);
        iVar16 = 0x1f;
        if ((*puVar5 | 1) != 0) {
          for (; (*puVar5 | 1) >> iVar16 == 0; iVar16 = iVar16 + -1) {
          }
        }
        sVar14 = sVar14 + (iVar16 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        iVar16 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar2 < iVar16);
    }
    break;
  case '\x0e':
    uVar12 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                          (undefined1  [16])
                          ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                          (undefined1  [16])0x4) == (undefined1  [16])0x0);
    sVar14 = lVar11 * (ulong)uVar12;
    iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        piVar8 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar2);
        lVar11 = 0x3f;
        if (((long)*piVar8 | 1U) != 0) {
          for (; ((long)*piVar8 | 1U) >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        sVar14 = sVar14 + ((int)lVar11 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        iVar16 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar2 < iVar16);
    }
    break;
  case '\x11':
    uVar12 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                          (undefined1  [16])
                          ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                          (undefined1  [16])0x4) == (undefined1  [16])0x0);
    sVar14 = lVar11 * (ulong)uVar12;
    iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        piVar8 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar2);
        uVar12 = *piVar8 >> 0x1f ^ *piVar8 * 2 | 1;
        iVar16 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar16 == 0; iVar16 = iVar16 + -1) {
          }
        }
        sVar14 = sVar14 + (iVar16 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        iVar16 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar2 < iVar16);
    }
    break;
  case '\x12':
    uVar12 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                          (undefined1  [16])
                          ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                          (undefined1  [16])0x4) == (undefined1  [16])0x0);
    sVar14 = lVar11 * (ulong)uVar12;
    iVar2 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        plVar3 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar2);
        uVar4 = *plVar3 >> 0x3f ^ *plVar3 * 2 | 1;
        lVar11 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        sVar14 = sVar14 + ((int)lVar11 * 9 + 0x49U >> 6);
        iVar2 = iVar2 + 1;
        iVar16 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
      } while (iVar2 < iVar16);
    }
    break;
  default:
    goto switchD_001f7c4e_default;
  }
  return sVar14;
}

Assistant:

size_t ExtensionSet::Extension::MessageSetItemByteSize(int number) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but compute the byte size for it the
    // normal way.
    return ByteSize(number);
  }

  if (is_cleared) return 0;

  size_t our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(number);

  // message
  our_size += WireFormatLite::LengthDelimitedSize(
      is_lazy ? ptr.lazymessage_value->ByteSizeLong()
              : ptr.message_value->ByteSizeLong());

  return our_size;
}